

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__fancy_alpha_weight_2ch(float *out_buffer,int width_times_channels)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float *pfVar10;
  float *pfVar11;
  
  pfVar1 = out_buffer + (width_times_channels / 2) * 3;
  pfVar11 = pfVar1 + -(long)width_times_channels + 8;
  pfVar10 = pfVar1 + -(long)width_times_channels;
  while (pfVar11 <= pfVar1) {
    fVar2 = *pfVar10;
    fVar3 = pfVar10[1];
    fVar4 = pfVar10[2];
    fVar5 = pfVar10[3];
    fVar6 = pfVar10[4];
    fVar7 = pfVar10[5];
    fVar8 = pfVar10[6];
    fVar9 = pfVar10[7];
    *out_buffer = fVar2;
    out_buffer[1] = fVar3;
    out_buffer[2] = fVar2 * fVar3;
    out_buffer[3] = fVar2 * fVar3;
    out_buffer[4] = fVar4 * fVar5;
    out_buffer[5] = fVar4 * fVar5;
    out_buffer[5] = fVar4;
    out_buffer[6] = fVar5;
    out_buffer[6] = fVar6;
    out_buffer[7] = fVar7;
    out_buffer[8] = fVar6 * fVar7;
    out_buffer[9] = fVar6 * fVar7;
    out_buffer[10] = fVar8 * fVar9;
    out_buffer[0xb] = fVar8 * fVar9;
    out_buffer[0xb] = fVar8;
    out_buffer[0xc] = fVar9;
    out_buffer = out_buffer + 0xc;
    pfVar11 = pfVar10 + 0x10;
    pfVar10 = pfVar10 + 8;
  }
  for (; pfVar10 < pfVar1; pfVar10 = pfVar10 + 2) {
    fVar2 = *pfVar10;
    fVar3 = pfVar10[1];
    *out_buffer = fVar2;
    out_buffer[1] = fVar3;
    out_buffer[2] = fVar2 * fVar3;
    out_buffer = out_buffer + 3;
  }
  return;
}

Assistant:

static void stbir__fancy_alpha_weight_2ch( float * out_buffer, int width_times_channels )
{
  float STBIR_STREAMOUT_PTR(*) out = out_buffer;
  float const * end_decode = out_buffer + ( width_times_channels / 2 ) * 3;
  float STBIR_STREAMOUT_PTR(*) decode = (float*)end_decode - width_times_channels;

  //  for fancy alpha, turns into: [X A Xpm][X A Xpm],etc

  #ifdef STBIR_SIMD

  decode += 8;
  if ( decode <= end_decode )
  {
    STBIR_NO_UNROLL_LOOP_START
    do {
      #ifdef STBIR_SIMD8
      stbir__simdf8 d0,a0,p0;
      STBIR_NO_UNROLL(decode);
      stbir__simdf8_load( d0, decode-8 );
      stbir__simdf8_0123to11331133( p0, d0 );
      stbir__simdf8_0123to00220022( a0, d0 );
      stbir__simdf8_mult( p0, p0, a0 );

      stbir__simdf_store2( out, stbir__if_simdf8_cast_to_simdf4( d0 ) );
      stbir__simdf_store( out+2, stbir__if_simdf8_cast_to_simdf4( p0 ) );
      stbir__simdf_store2h( out+3, stbir__if_simdf8_cast_to_simdf4( d0 ) );

      stbir__simdf_store2( out+6, stbir__simdf8_gettop4( d0 ) );
      stbir__simdf_store( out+8, stbir__simdf8_gettop4( p0 ) );
      stbir__simdf_store2h( out+9, stbir__simdf8_gettop4( d0 ) );
      #else
      stbir__simdf d0,a0,d1,a1,p0,p1;
      STBIR_NO_UNROLL(decode);
      stbir__simdf_load( d0, decode-8 );
      stbir__simdf_load( d1, decode-8+4 );
      stbir__simdf_0123to1133( p0, d0 );
      stbir__simdf_0123to1133( p1, d1 );
      stbir__simdf_0123to0022( a0, d0 );
      stbir__simdf_0123to0022( a1, d1 );
      stbir__simdf_mult( p0, p0, a0 );
      stbir__simdf_mult( p1, p1, a1 );

      stbir__simdf_store2( out, d0 );
      stbir__simdf_store( out+2, p0 );
      stbir__simdf_store2h( out+3, d0 );

      stbir__simdf_store2( out+6, d1 );
      stbir__simdf_store( out+8, p1 );
      stbir__simdf_store2h( out+9, d1 );
      #endif
      decode += 8;
      out += 12;
    } while ( decode <= end_decode );
  }
  decode -= 8;
  #endif

  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode < end_decode )
  {
    float x = decode[0], y = decode[1];
    STBIR_SIMD_NO_UNROLL(decode);
    out[0] = x;
    out[1] = y;
    out[2] = x * y;
    out += 3;
    decode += 2;
  }
}